

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

ExprNode * __thiscall Translator::visit(Translator *this,AssignNode *assignNode)

{
  int iVar1;
  int iVar2;
  MOVE *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = (MOVE *)operator_new(0x20);
  iVar1 = (*(assignNode->exp1->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                    (assignNode->exp1,this);
  iVar2 = (*(assignNode->exp2->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                    (assignNode->exp2,this);
  MOVE::MOVE(this_00,(ExprNode *)CONCAT44(extraout_var,iVar1),
             (ExprNode *)CONCAT44(extraout_var_00,iVar2));
  return (ExprNode *)this_00;
}

Assistant:

ExprNode *Translator::visit(AssignNode *assignNode) {
    return (ExprNode *) (new MOVE(assignNode->getExp1()->accept(this), assignNode->getExp2()->accept(this)));

}